

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O2

vector<RPCResult,_std::allocator<RPCResult>_> *
DecodeTxDoc(vector<RPCResult,_std::allocator<RPCResult>_> *__return_storage_ptr__,
           string *txid_field_doc)

{
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  string m_key_name_10;
  string m_key_name_11;
  string m_key_name_12;
  string m_key_name_13;
  string m_key_name_14;
  string m_key_name_15;
  string m_key_name_16;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_16;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_17;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_18;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_19;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_20;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_21;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  long lVar6;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<RPCResult> __l_05;
  undefined4 in_stack_ffffffffffffeac8;
  undefined4 uVar7;
  undefined1 in_stack_ffffffffffffeacc [28];
  string in_stack_ffffffffffffeae8;
  pointer in_stack_ffffffffffffeb08;
  pointer pRVar8;
  pointer in_stack_ffffffffffffeb10;
  pointer pRVar9;
  pointer in_stack_ffffffffffffeb18;
  pointer pRVar10;
  allocator<char> local_14da;
  allocator<char> local_14d9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_14d8;
  allocator<char> local_14b9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_14b8;
  allocator<char> local_149a;
  allocator<char> local_1499;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1498;
  allocator<char> local_147c;
  allocator<char> local_147b;
  allocator_type local_147a;
  allocator_type local_1479;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1478;
  allocator<char> local_145b;
  allocator<char> local_145a;
  allocator_type local_1459;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1458;
  allocator<char> local_143a;
  allocator<char> local_1439;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1438;
  allocator<char> local_141b;
  allocator<char> local_141a;
  allocator_type local_1419;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1418;
  allocator<char> local_13fa;
  allocator<char> local_13f9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_13f8;
  allocator<char> local_13da;
  allocator<char> local_13d9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_13d8;
  allocator<char> local_13ba;
  allocator<char> local_13b9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_13b8;
  allocator<char> local_139a;
  allocator<char> local_1399;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1398;
  allocator<char> local_137a;
  allocator<char> local_1379;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1378;
  allocator<char> local_135a;
  allocator<char> local_1359;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1358;
  allocator<char> local_133a;
  allocator<char> local_1339;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1338;
  allocator<char> local_131a;
  allocator<char> local_1319;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1318;
  allocator<char> local_12fa;
  allocator<char> local_12f9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_12f8;
  allocator<char> local_12da;
  allocator<char> local_12d9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_12d8;
  allocator<char> local_12ba;
  allocator<char> local_12b9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_12b8;
  allocator<char> local_129a;
  allocator<char> local_1299;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1298;
  allocator<char> local_127a;
  allocator<char> local_1279;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1278;
  allocator<char> local_125a;
  allocator<char> local_1259;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1258;
  allocator<char> local_1231;
  string local_1230 [32];
  string local_1210 [32];
  string local_11f0 [32];
  string local_11d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11b0;
  string local_1190 [32];
  RPCResult local_1170 [2];
  pointer local_1030;
  string local_fd8 [32];
  string local_fb8 [32];
  RPCResult local_f98;
  string local_f10 [32];
  string local_ef0 [32];
  string local_ed0 [32];
  string local_eb0 [32];
  string local_e90 [32];
  string local_e70 [32];
  RPCResult local_e50;
  string local_dc8 [32];
  string local_da8 [32];
  string local_d88 [32];
  string local_d68 [32];
  string local_d48 [32];
  string local_d28 [32];
  RPCResult local_d08 [2];
  string local_bf8 [32];
  string local_bd8 [32];
  string local_bb8 [32];
  string local_b98 [32];
  string local_b78 [32];
  string local_b58 [32];
  string local_b38 [32];
  string local_b18 [32];
  RPCResult local_af8 [4];
  RPCResult local_8d8;
  RPCResult local_850;
  string local_7c8 [32];
  string local_7a8 [32];
  RPCResult local_788;
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  RPCResult local_500 [4];
  RPCResult local_2e0;
  RPCResult local_258;
  RPCResult local_1d0;
  RPCResult local_148;
  RPCResult local_c0;
  long local_38;
  
  local_1030 = (pointer)0x0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_520,"txid",&local_1231);
  std::__cxx11::string::string(local_540,txid_field_doc);
  local_1258.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1258.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1258.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._4_28_ = in_stack_ffffffffffffeacc;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeac8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_ffffffffffffeb10;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_ffffffffffffeb08;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffeb18;
  RPCResult::RPCResult
            (local_500,STR_HEX,m_key_name,in_stack_ffffffffffffeae8,inner,SUB81(local_520,0));
  std::__cxx11::string::string<std::allocator<char>>(local_560,"hash",&local_1259);
  std::__cxx11::string::string<std::allocator<char>>
            (local_580,"The transaction hash (differs from txid for witness transactions)",
             &local_125a);
  local_1278.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1278.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1278.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._4_28_ = in_stack_ffffffffffffeacc;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeac8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb10;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb08;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb18;
  RPCResult::RPCResult
            (local_500 + 1,STR_HEX,m_key_name_00,in_stack_ffffffffffffeae8,inner_00,
             SUB81(local_560,0));
  std::__cxx11::string::string<std::allocator<char>>(local_5a0,"size",&local_1279);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5c0,"The serialized transaction size",&local_127a);
  local_1298.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1298.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1298.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._4_28_ = in_stack_ffffffffffffeacc;
  m_key_name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeac8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb10;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb08;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb18;
  RPCResult::RPCResult
            (local_500 + 2,NUM,m_key_name_01,in_stack_ffffffffffffeae8,inner_01,SUB81(local_5a0,0));
  std::__cxx11::string::string<std::allocator<char>>(local_5e0,"vsize",&local_1299);
  std::__cxx11::string::string<std::allocator<char>>
            (local_600,"The virtual transaction size (differs from size for witness transactions)",
             &local_129a);
  local_12b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_12b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._4_28_ = in_stack_ffffffffffffeacc;
  m_key_name_02._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeac8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb10;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb08;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb18;
  RPCResult::RPCResult
            (local_500 + 3,NUM,m_key_name_02,in_stack_ffffffffffffeae8,inner_02,SUB81(local_5e0,0));
  std::__cxx11::string::string<std::allocator<char>>(local_620,"weight",&local_12b9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_640,"The transaction\'s weight (between vsize*4-3 and vsize*4)",&local_12ba);
  local_12d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_12d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._4_28_ = in_stack_ffffffffffffeacc;
  m_key_name_03._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeac8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb10;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb08;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb18;
  RPCResult::RPCResult
            (&local_2e0,NUM,m_key_name_03,in_stack_ffffffffffffeae8,inner_03,SUB81(local_620,0));
  std::__cxx11::string::string<std::allocator<char>>(local_660,"version",&local_12d9);
  std::__cxx11::string::string<std::allocator<char>>(local_680,"The version",&local_12da);
  local_12f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_12f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_04._4_28_ = in_stack_ffffffffffffeacc;
  m_key_name_04._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeac8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb10;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb08;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb18;
  RPCResult::RPCResult
            (&local_258,NUM,m_key_name_04,in_stack_ffffffffffffeae8,inner_04,SUB81(local_660,0));
  std::__cxx11::string::string<std::allocator<char>>(local_6a0,"locktime",&local_12f9);
  std::__cxx11::string::string<std::allocator<char>>(local_6c0,"The lock time",&local_12fa);
  local_1318.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1318.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1318.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_05._4_28_ = in_stack_ffffffffffffeacc;
  m_key_name_05._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeac8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb10;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb08;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb18;
  RPCResult::RPCResult
            (&local_1d0,NUM_TIME,m_key_name_05,in_stack_ffffffffffffeae8,inner_05,SUB81(local_6a0,0)
            );
  std::__cxx11::string::string<std::allocator<char>>(local_6e0,"vin",&local_1319);
  std::__cxx11::string::string<std::allocator<char>>(local_700,"",&local_131a);
  std::__cxx11::string::string<std::allocator<char>>(local_7a8,"",&local_1339);
  std::__cxx11::string::string<std::allocator<char>>(local_7c8,"",&local_133a);
  std::__cxx11::string::string<std::allocator<char>>(local_b18,"coinbase",&local_1359);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b38,"The coinbase value (only if coinbase transaction)",&local_135a);
  local_1378.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1378.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1378.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar1._28_4_ = 0;
  auVar1._0_28_ = in_stack_ffffffffffffeacc;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb10;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb08;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb18;
  RPCResult::RPCResult
            (local_af8,STR_HEX,(string)(auVar1 << 0x20),SUB81(local_b18,0),in_stack_ffffffffffffeae8
             ,inner_06,true);
  std::__cxx11::string::string<std::allocator<char>>(local_b58,"txid",&local_1379);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b78,"The transaction id (if not coinbase transaction)",&local_137a);
  local_1398.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1398.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1398.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar2._28_4_ = 0;
  auVar2._0_28_ = in_stack_ffffffffffffeacc;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb10;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb08;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb18;
  RPCResult::RPCResult
            (local_af8 + 1,STR_HEX,(string)(auVar2 << 0x20),SUB81(local_b58,0),
             in_stack_ffffffffffffeae8,inner_07,true);
  std::__cxx11::string::string<std::allocator<char>>(local_b98,"vout",&local_1399);
  std::__cxx11::string::string<std::allocator<char>>
            (local_bb8,"The output number (if not coinbase transaction)",&local_139a);
  local_13b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_13b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar7 = 0;
  auVar3._28_4_ = 0;
  auVar3._0_28_ = in_stack_ffffffffffffeacc;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb10;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb08;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb18;
  RPCResult::RPCResult
            (local_af8 + 2,NUM,(string)(auVar3 << 0x20),SUB81(local_b98,0),in_stack_ffffffffffffeae8
             ,inner_08,true);
  std::__cxx11::string::string<std::allocator<char>>(local_bd8,"scriptSig",&local_13b9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_bf8,"The script (if not coinbase transaction)",&local_13ba);
  std::__cxx11::string::string<std::allocator<char>>(local_d28,"asm",&local_13d9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_d48,"Disassembly of the signature script",&local_13da);
  local_13f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_13f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_06._4_28_ = in_stack_ffffffffffffeacc;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar7;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb10;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb08;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb18;
  RPCResult::RPCResult
            (local_d08,STR,m_key_name_06,in_stack_ffffffffffffeae8,inner_09,SUB81(local_d28,0));
  std::__cxx11::string::string<std::allocator<char>>(local_d68,"hex",&local_13f9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_d88,"The raw signature script bytes, hex-encoded",&local_13fa);
  local_1418.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1418.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1418.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_07._4_28_ = in_stack_ffffffffffffeacc;
  m_key_name_07._M_dataplus._M_p._0_4_ = uVar7;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb10;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb08;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb18;
  RPCResult::RPCResult
            (local_d08 + 1,STR_HEX,m_key_name_07,in_stack_ffffffffffffeae8,inner_10,
             SUB81(local_d68,0));
  __l._M_len = 2;
  __l._M_array = local_d08;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_13d8,__l,&local_1419);
  uVar7 = 0;
  auVar4._28_4_ = 0;
  auVar4._0_28_ = in_stack_ffffffffffffeacc;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb10;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb08;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb18;
  RPCResult::RPCResult
            (local_af8 + 3,OBJ,(string)(auVar4 << 0x20),SUB81(local_bd8,0),in_stack_ffffffffffffeae8
             ,inner_11,true);
  std::__cxx11::string::string<std::allocator<char>>(local_da8,"txinwitness",&local_141a);
  std::__cxx11::string::string<std::allocator<char>>(local_dc8,"",&local_141b);
  std::__cxx11::string::string<std::allocator<char>>(local_e70,"hex",&local_1439);
  std::__cxx11::string::string<std::allocator<char>>
            (local_e90,"hex-encoded witness data (if any)",&local_143a);
  local_1458.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1458.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1458.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_08._4_28_ = in_stack_ffffffffffffeacc;
  m_key_name_08._M_dataplus._M_p._0_4_ = uVar7;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb10;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb08;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb18;
  RPCResult::RPCResult
            (&local_e50,STR_HEX,m_key_name_08,in_stack_ffffffffffffeae8,inner_12,SUB81(local_e70,0))
  ;
  __l_00._M_len = 1;
  __l_00._M_array = &local_e50;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1438,__l_00,&local_1459);
  uVar7 = 0;
  auVar5._28_4_ = 0;
  auVar5._0_28_ = in_stack_ffffffffffffeacc;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb10;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb08;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb18;
  RPCResult::RPCResult
            (&local_8d8,ARR,(string)(auVar5 << 0x20),SUB81(local_da8,0),in_stack_ffffffffffffeae8,
             inner_13,true);
  std::__cxx11::string::string<std::allocator<char>>(local_eb0,"sequence",&local_145a);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ed0,"The script sequence number",&local_145b);
  local_1478.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1478.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1478.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_09._4_28_ = in_stack_ffffffffffffeacc;
  m_key_name_09._M_dataplus._M_p._0_4_ = uVar7;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb10;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb08;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb18;
  RPCResult::RPCResult
            (&local_850,NUM,m_key_name_09,in_stack_ffffffffffffeae8,inner_14,SUB81(local_eb0,0));
  __l_01._M_len = 6;
  __l_01._M_array = local_af8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1358,__l_01,&local_1479);
  m_key_name_10._4_28_ = in_stack_ffffffffffffeacc;
  m_key_name_10._M_dataplus._M_p._0_4_ = uVar7;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb10;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb08;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb18;
  RPCResult::RPCResult
            (&local_788,OBJ,m_key_name_10,in_stack_ffffffffffffeae8,inner_15,SUB81(local_7a8,0));
  __l_02._M_len = 1;
  __l_02._M_array = &local_788;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1338,__l_02,&local_147a);
  m_key_name_11._4_28_ = in_stack_ffffffffffffeacc;
  m_key_name_11._M_dataplus._M_p._0_4_ = uVar7;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb10;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb08;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb18;
  RPCResult::RPCResult
            (&local_148,ARR,m_key_name_11,in_stack_ffffffffffffeae8,inner_16,SUB81(local_6e0,0));
  std::__cxx11::string::string<std::allocator<char>>(local_ef0,"vout",&local_147b);
  std::__cxx11::string::string<std::allocator<char>>(local_f10,"",&local_147c);
  std::__cxx11::string::string<std::allocator<char>>(local_fb8,"",&local_1499);
  std::__cxx11::string::string<std::allocator<char>>(local_fd8,"",&local_149a);
  std::__cxx11::string::string<std::allocator<char>>(local_1190,"value",&local_14b9);
  std::operator+(&local_11b0,"The value in ",&CURRENCY_UNIT_abi_cxx11_);
  local_14d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_14d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_14d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_12._4_28_ = in_stack_ffffffffffffeacc;
  m_key_name_12._M_dataplus._M_p._0_4_ = uVar7;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb10;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb08;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb18;
  RPCResult::RPCResult
            (local_1170,STR_AMOUNT,m_key_name_12,in_stack_ffffffffffffeae8,inner_17,
             SUB81(local_1190,0));
  std::__cxx11::string::string<std::allocator<char>>(local_11d0,"n",&local_14d9);
  std::__cxx11::string::string<std::allocator<char>>(local_11f0,"index",&local_14da);
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  m_key_name_13._4_28_ = in_stack_ffffffffffffeacc;
  m_key_name_13._M_dataplus._M_p._0_4_ = uVar7;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult
            (local_1170 + 1,NUM,m_key_name_13,in_stack_ffffffffffffeae8,inner_18,SUB81(local_11d0,0)
            );
  std::__cxx11::string::string<std::allocator<char>>
            (local_1210,"scriptPubKey",(allocator<char> *)&stack0xffffffffffffeb07);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1230,"",(allocator<char> *)&stack0xffffffffffffeb06);
  ScriptPubKeyDoc();
  m_key_name_14._4_28_ = in_stack_ffffffffffffeacc;
  m_key_name_14._M_dataplus._M_p._0_4_ = uVar7;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar9;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar8;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = pRVar10;
  RPCResult::RPCResult
            ((RPCResult *)&stack0xffffffffffffefa0,OBJ,m_key_name_14,in_stack_ffffffffffffeae8,
             inner_19,SUB81(local_1210,0));
  __l_03._M_len = 3;
  __l_03._M_array = local_1170;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_14b8,__l_03,(allocator_type *)&stack0xffffffffffffeae7);
  m_key_name_15._4_28_ = in_stack_ffffffffffffeacc;
  m_key_name_15._M_dataplus._M_p._0_4_ = uVar7;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar9;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar8;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = pRVar10;
  RPCResult::RPCResult
            (&local_f98,OBJ,m_key_name_15,in_stack_ffffffffffffeae8,inner_20,SUB81(local_fb8,0));
  __l_04._M_len = 1;
  __l_04._M_array = &local_f98;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1498,__l_04,(allocator_type *)&stack0xffffffffffffeae6);
  m_key_name_16._4_28_ = in_stack_ffffffffffffeacc;
  m_key_name_16._M_dataplus._M_p._0_4_ = uVar7;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar9;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar8;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = pRVar10;
  RPCResult::RPCResult
            (&local_c0,ARR,m_key_name_16,in_stack_ffffffffffffeae8,inner_21,SUB81(local_ef0,0));
  __l_05._M_len = 9;
  __l_05._M_array = local_500;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (__return_storage_ptr__,__l_05,(allocator_type *)&stack0xffffffffffffeae5);
  lVar6 = 0x440;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_500[0].m_type + lVar6));
    lVar6 = lVar6 + -0x88;
  } while (lVar6 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1498);
  RPCResult::~RPCResult(&local_f98);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_14b8);
  lVar6 = 0x110;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_1170[0].m_type + lVar6));
    lVar6 = lVar6 + -0x88;
  } while (lVar6 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeae8);
  std::__cxx11::string::~string(local_1230);
  std::__cxx11::string::~string(local_1210);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeb08);
  std::__cxx11::string::~string(local_11f0);
  std::__cxx11::string::~string(local_11d0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_14d8);
  std::__cxx11::string::~string((string *)&local_11b0);
  std::__cxx11::string::~string(local_1190);
  std::__cxx11::string::~string(local_fd8);
  std::__cxx11::string::~string(local_fb8);
  std::__cxx11::string::~string(local_f10);
  std::__cxx11::string::~string(local_ef0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1338);
  RPCResult::~RPCResult(&local_788);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1358);
  lVar6 = 0x2a8;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_af8[0].m_type + lVar6));
    lVar6 = lVar6 + -0x88;
  } while (lVar6 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1478);
  std::__cxx11::string::~string(local_ed0);
  std::__cxx11::string::~string(local_eb0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1438);
  RPCResult::~RPCResult(&local_e50);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1458);
  std::__cxx11::string::~string(local_e90);
  std::__cxx11::string::~string(local_e70);
  std::__cxx11::string::~string(local_dc8);
  std::__cxx11::string::~string(local_da8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_13d8);
  lVar6 = 0x88;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_d08[0].m_type + lVar6));
    lVar6 = lVar6 + -0x88;
  } while (lVar6 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1418);
  std::__cxx11::string::~string(local_d88);
  std::__cxx11::string::~string(local_d68);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_13f8);
  std::__cxx11::string::~string(local_d48);
  std::__cxx11::string::~string(local_d28);
  std::__cxx11::string::~string(local_bf8);
  std::__cxx11::string::~string(local_bd8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_13b8);
  std::__cxx11::string::~string(local_bb8);
  std::__cxx11::string::~string(local_b98);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1398);
  std::__cxx11::string::~string(local_b78);
  std::__cxx11::string::~string(local_b58);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1378);
  std::__cxx11::string::~string(local_b38);
  std::__cxx11::string::~string(local_b18);
  std::__cxx11::string::~string(local_7c8);
  std::__cxx11::string::~string(local_7a8);
  std::__cxx11::string::~string(local_700);
  std::__cxx11::string::~string(local_6e0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1318);
  std::__cxx11::string::~string(local_6c0);
  std::__cxx11::string::~string(local_6a0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_12f8);
  std::__cxx11::string::~string(local_680);
  std::__cxx11::string::~string(local_660);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_12d8);
  std::__cxx11::string::~string(local_640);
  std::__cxx11::string::~string(local_620);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_12b8);
  std::__cxx11::string::~string(local_600);
  std::__cxx11::string::~string(local_5e0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1298);
  std::__cxx11::string::~string(local_5c0);
  std::__cxx11::string::~string(local_5a0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1278);
  std::__cxx11::string::~string(local_580);
  std::__cxx11::string::~string(local_560);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1258);
  std::__cxx11::string::~string(local_540);
  std::__cxx11::string::~string(local_520);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static std::vector<RPCResult> DecodeTxDoc(const std::string& txid_field_doc)
{
    return {
        {RPCResult::Type::STR_HEX, "txid", txid_field_doc},
        {RPCResult::Type::STR_HEX, "hash", "The transaction hash (differs from txid for witness transactions)"},
        {RPCResult::Type::NUM, "size", "The serialized transaction size"},
        {RPCResult::Type::NUM, "vsize", "The virtual transaction size (differs from size for witness transactions)"},
        {RPCResult::Type::NUM, "weight", "The transaction's weight (between vsize*4-3 and vsize*4)"},
        {RPCResult::Type::NUM, "version", "The version"},
        {RPCResult::Type::NUM_TIME, "locktime", "The lock time"},
        {RPCResult::Type::ARR, "vin", "",
        {
            {RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::STR_HEX, "coinbase", /*optional=*/true, "The coinbase value (only if coinbase transaction)"},
                {RPCResult::Type::STR_HEX, "txid", /*optional=*/true, "The transaction id (if not coinbase transaction)"},
                {RPCResult::Type::NUM, "vout", /*optional=*/true, "The output number (if not coinbase transaction)"},
                {RPCResult::Type::OBJ, "scriptSig", /*optional=*/true, "The script (if not coinbase transaction)",
                {
                    {RPCResult::Type::STR, "asm", "Disassembly of the signature script"},
                    {RPCResult::Type::STR_HEX, "hex", "The raw signature script bytes, hex-encoded"},
                }},
                {RPCResult::Type::ARR, "txinwitness", /*optional=*/true, "",
                {
                    {RPCResult::Type::STR_HEX, "hex", "hex-encoded witness data (if any)"},
                }},
                {RPCResult::Type::NUM, "sequence", "The script sequence number"},
            }},
        }},
        {RPCResult::Type::ARR, "vout", "",
        {
            {RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::STR_AMOUNT, "value", "The value in " + CURRENCY_UNIT},
                {RPCResult::Type::NUM, "n", "index"},
                {RPCResult::Type::OBJ, "scriptPubKey", "", ScriptPubKeyDoc()},
            }},
        }},
    };
}